

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

char * nlohmann::detail::to_chars<double>(char *first,char *last,double value)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  size_t __n;
  long lVar6;
  byte *pbVar7;
  uint uVar8;
  size_t __n_00;
  int iVar9;
  int decimal_exponent;
  int len;
  int local_28 [2];
  
  if ((long)value < 0) {
    value = (double)((ulong)value ^ (ulong)DAT_001afe10);
    *first = '-';
    first = first + 1;
  }
  if ((value == 0.0) && (!NAN(value))) {
    first[0] = '0';
    first[1] = '.';
    first[2] = '0';
    return first + 3;
  }
  local_28[0] = 0;
  local_28[1] = 0;
  dtoa_impl::grisu2<double>(first,local_28 + 1,local_28,value);
  iVar3 = local_28[1];
  __n_00 = (size_t)local_28[1];
  __n = (size_t)local_28[0];
  uVar1 = __n + __n_00;
  iVar9 = (int)uVar1;
  if ((-1 < (long)__n) && (iVar9 < 0x10)) {
    memset(first + __n_00,0x30,__n);
    pcVar2 = first + uVar1;
    pcVar2[0] = '.';
    pcVar2[1] = '0';
    return pcVar2 + 2;
  }
  if (0xfffffff0 < iVar9 - 0x10U) {
    memmove(first + (uVar1 & 0xffffffff) + 1,first + (uVar1 & 0xffffffff),(long)-local_28[0]);
    first[uVar1 & 0xffffffff] = '.';
    return first + __n_00 + 1;
  }
  if (iVar9 + 3U < 4) {
    memmove(first + (2U - iVar9),first,__n_00);
    first[0] = '0';
    first[1] = '.';
    memset(first + 2,0x30,(ulong)(uint)-iVar9);
    return first + (int)((2U - iVar9) + iVar3);
  }
  if (local_28[1] != 1) {
    memmove(first + 2,first + 1,__n_00 - 1);
    first[1] = '.';
    first = first + __n_00;
  }
  first[1] = 'e';
  uVar8 = iVar9 - 1;
  uVar5 = -uVar8;
  if (0 < (int)uVar8) {
    uVar5 = uVar8;
  }
  first[2] = (iVar9 < 1) * '\x02' + '+';
  if (uVar5 < 10) {
    first[3] = '0';
  }
  else {
    if (99 < uVar5) {
      first[3] = (char)(uVar5 / 100) + '0';
      bVar4 = (byte)((uVar5 % 100) / 10);
      first[4] = bVar4 | 0x30;
      pbVar7 = (byte *)(first + 5);
      bVar4 = (char)(uVar5 % 100) + bVar4 * -10;
      lVar6 = 4;
      goto LAB_0016a41f;
    }
    bVar4 = (byte)((uVar5 & 0xff) / 10);
    first[3] = bVar4 | 0x30;
    uVar5 = (uint)(byte)((char)uVar5 + bVar4 * -10);
  }
  bVar4 = (byte)uVar5;
  pbVar7 = (byte *)(first + 4);
  lVar6 = 3;
LAB_0016a41f:
  *pbVar7 = bVar4 | 0x30;
  return first + lVar6 + 2;
}

Assistant:

char* to_chars(char* first, char* last, FloatType value)
{
    static_cast<void>(last); // maybe unused - fix warning
    assert(std::isfinite(value));

    // Use signbit(value) instead of (value < 0) since signbit works for -0.
    if (std::signbit(value))
    {
        value = -value;
        *first++ = '-';
    }

    if (value == 0) // +-0
    {
        *first++ = '0';
        // Make it look like a floating-point number (#362, #378)
        *first++ = '.';
        *first++ = '0';
        return first;
    }

    assert(last - first >= std::numeric_limits<FloatType>::max_digits10);

    // Compute v = buffer * 10^decimal_exponent.
    // The decimal digits are stored in the buffer, which needs to be interpreted
    // as an unsigned decimal integer.
    // len is the length of the buffer, i.e. the number of decimal digits.
    int len = 0;
    int decimal_exponent = 0;
    dtoa_impl::grisu2(first, len, decimal_exponent, value);

    assert(len <= std::numeric_limits<FloatType>::max_digits10);

    // Format the buffer like printf("%.*g", prec, value)
    constexpr int kMinExp = -4;
    // Use digits10 here to increase compatibility with version 2.
    constexpr int kMaxExp = std::numeric_limits<FloatType>::digits10;

    assert(last - first >= kMaxExp + 2);
    assert(last - first >= 2 + (-kMinExp - 1) + std::numeric_limits<FloatType>::max_digits10);
    assert(last - first >= std::numeric_limits<FloatType>::max_digits10 + 6);

    return dtoa_impl::format_buffer(first, len, decimal_exponent, kMinExp, kMaxExp);
}